

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_PackedSerializationToStream_Test::
TestBody(ExtensionSetTest_PackedSerializationToStream_Test *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  char *in_R9;
  string_view data_00;
  AssertHelper AStack_238;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_230;
  AssertionResult gtest_ar_;
  string local_218;
  string data;
  CodedOutputStream output_stream;
  ArrayOutputStream array_stream;
  TestPackedExtensions source;
  TestPackedTypes destination;
  
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&source);
  proto2_unittest::TestPackedTypes::TestPackedTypes(&destination);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>(&source);
  sVar3 = proto2_unittest::TestPackedExtensions::ByteSizeLong(&source);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&data);
  io::ArrayOutputStream::ArrayOutputStream(&array_stream,data._M_dataplus._M_p,(int)sVar3,1);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ArrayOutputStream,void>
            (&output_stream,&array_stream);
  iVar2 = (*source.super_Message.super_MessageLite._vptr_MessageLite[5])(&source,output_stream.cur_)
  ;
  output_stream.cur_ = (uint8_t *)CONCAT44(extraout_var,iVar2);
  bVar1 = io::CodedOutputStream::HadError(&output_stream);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_218,(internal *)&gtest_ar_,(AssertionResult *)"output_stream.HadError()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x262,local_218._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_238,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&AStack_238);
    std::__cxx11::string::~string((string *)&local_218);
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    io::CodedOutputStream::~CodedOutputStream(&output_stream);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    io::CodedOutputStream::~CodedOutputStream(&output_stream);
    data_00._M_str = data._M_dataplus._M_p;
    data_00._M_len = data._M_string_length;
    array_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream._0_1_ =
         MessageLite::ParseFromString((MessageLite *)&destination,data_00);
    array_stream.data_ = (uint8_t *)0x0;
    if (!(bool)array_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream._0_1_) {
      testing::Message::Message((Message *)&local_218);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&output_stream,(internal *)&array_stream,
                 (AssertionResult *)"destination.ParseFromString(data)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x264,(char *)output_stream.impl_.end_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_218);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&output_stream);
      if ((long *)local_218._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_218._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&array_stream.data_);
    TestUtil::ExpectPackedFieldsSet<proto2_unittest::TestPackedTypes>(&destination);
  }
  std::__cxx11::string::~string((string *)&data);
  proto2_unittest::TestPackedTypes::~TestPackedTypes(&destination);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&source);
  return;
}

Assistant:

TEST(ExtensionSetTest, PackedSerializationToStream) {
  // Serialize as TestPackedExtensions and parse as TestPackedTypes to insure
  // wire compatibility of extensions.
  //
  // This checks serialization to an output stream by creating an array output
  // stream that can only buffer 1 byte at a time - this prevents the message
  // from ever jumping to the fast path, ensuring that serialization happens via
  // the CodedOutputStream.
  unittest::TestPackedExtensions source;
  unittest::TestPackedTypes destination;
  TestUtil::SetPackedExtensions(&source);
  size_t size = source.ByteSizeLong();
  std::string data;
  data.resize(size);
  {
    io::ArrayOutputStream array_stream(&data[0], size, 1);
    io::CodedOutputStream output_stream(&array_stream);
    source.SerializeWithCachedSizes(&output_stream);
    ASSERT_FALSE(output_stream.HadError());
  }
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectPackedFieldsSet(destination);
}